

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall pugi::xml_document::document_element(xml_document *this)

{
  xml_node xVar1;
  
  for (xVar1._root = ((this->super_xml_node)._root)->first_child;
      (xVar1._root != (xml_node_struct *)0x0 && (((xVar1._root)->header & 0xf) != 2));
      xVar1._root = (xVar1._root)->next_sibling) {
  }
  return (xml_node)xVar1._root;
}

Assistant:

PUGI__FN xml_node xml_document::document_element() const
	{
		assert(_root);

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			if (PUGI__NODETYPE(i) == node_element)
				return xml_node(i);

		return xml_node();
	}